

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O1

void FastPForLib::fastunpack(uint32_t *in,uint32_t *out,uint32_t bit)

{
  switch(bit) {
  case 0:
    __fastunpack0(in,out);
    return;
  case 1:
    __fastunpack1(in,out);
    return;
  case 2:
    __fastunpack2(in,out);
    return;
  case 3:
    __fastunpack3(in,out);
    return;
  case 4:
    __fastunpack4(in,out);
    return;
  case 5:
    __fastunpack5(in,out);
    return;
  case 6:
    __fastunpack6(in,out);
    return;
  case 7:
    __fastunpack7(in,out);
    return;
  case 8:
    __fastunpack8(in,out);
    return;
  case 9:
    __fastunpack9(in,out);
    return;
  case 10:
    __fastunpack10(in,out);
    return;
  case 0xb:
    __fastunpack11(in,out);
    return;
  case 0xc:
    __fastunpack12(in,out);
    return;
  case 0xd:
    __fastunpack13(in,out);
    return;
  case 0xe:
    __fastunpack14(in,out);
    return;
  case 0xf:
    __fastunpack15(in,out);
    return;
  case 0x10:
    __fastunpack16(in,out);
    return;
  case 0x11:
    __fastunpack17(in,out);
    return;
  case 0x12:
    __fastunpack18(in,out);
    return;
  case 0x13:
    __fastunpack19(in,out);
    return;
  case 0x14:
    __fastunpack20(in,out);
    return;
  case 0x15:
    __fastunpack21(in,out);
    return;
  case 0x16:
    __fastunpack22(in,out);
    return;
  case 0x17:
    __fastunpack23(in,out);
    return;
  case 0x18:
    __fastunpack24(in,out);
    return;
  case 0x19:
    __fastunpack25(in,out);
    return;
  case 0x1a:
    __fastunpack26(in,out);
    return;
  case 0x1b:
    __fastunpack27(in,out);
    return;
  case 0x1c:
    __fastunpack28(in,out);
    return;
  case 0x1d:
    __fastunpack29(in,out);
    return;
  case 0x1e:
    __fastunpack30(in,out);
    return;
  case 0x1f:
    __fastunpack31(in,out);
    return;
  case 0x20:
    __fastunpack32(in,out);
    return;
  default:
    return;
  }
}

Assistant:

inline void fastunpack(const uint32_t *__restrict__ in,
                       uint32_t *__restrict__ out, const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    __fastunpack0(in, out);
    break;
  case 1:
    __fastunpack1(in, out);
    break;
  case 2:
    __fastunpack2(in, out);
    break;
  case 3:
    __fastunpack3(in, out);
    break;
  case 4:
    __fastunpack4(in, out);
    break;
  case 5:
    __fastunpack5(in, out);
    break;
  case 6:
    __fastunpack6(in, out);
    break;
  case 7:
    __fastunpack7(in, out);
    break;
  case 8:
    __fastunpack8(in, out);
    break;
  case 9:
    __fastunpack9(in, out);
    break;
  case 10:
    __fastunpack10(in, out);
    break;
  case 11:
    __fastunpack11(in, out);
    break;
  case 12:
    __fastunpack12(in, out);
    break;
  case 13:
    __fastunpack13(in, out);
    break;
  case 14:
    __fastunpack14(in, out);
    break;
  case 15:
    __fastunpack15(in, out);
    break;
  case 16:
    __fastunpack16(in, out);
    break;
  case 17:
    __fastunpack17(in, out);
    break;
  case 18:
    __fastunpack18(in, out);
    break;
  case 19:
    __fastunpack19(in, out);
    break;
  case 20:
    __fastunpack20(in, out);
    break;
  case 21:
    __fastunpack21(in, out);
    break;
  case 22:
    __fastunpack22(in, out);
    break;
  case 23:
    __fastunpack23(in, out);
    break;
  case 24:
    __fastunpack24(in, out);
    break;
  case 25:
    __fastunpack25(in, out);
    break;
  case 26:
    __fastunpack26(in, out);
    break;
  case 27:
    __fastunpack27(in, out);
    break;
  case 28:
    __fastunpack28(in, out);
    break;
  case 29:
    __fastunpack29(in, out);
    break;
  case 30:
    __fastunpack30(in, out);
    break;
  case 31:
    __fastunpack31(in, out);
    break;
  case 32:
    __fastunpack32(in, out);
    break;
  default:
    break;
  }
}